

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

CFGNode * __thiscall
dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling
          (CFGStructurizer *this,CFGNode *node,CFGNode *header,CFGNode *loop_ladder,
          CFGNode *target_header,CFGNode *full_break_target,
          UnorderedSet<const_CFGNode_*> *normal_preds)

{
  CFGNode *pCVar1;
  CFGNode *pCVar2;
  uint uVar3;
  CFGNode *false_block;
  bool bVar4;
  size_type sVar5;
  reference ppCVar6;
  ulong uVar7;
  LoggingCallback p_Var8;
  void *pvVar9;
  ThreadLocalAllocator<char> local_1161;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_1160;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_1140;
  anon_class_8_1_3dd19718 local_1120;
  function<bool_(const_dxil_spv::CFGNode_*)> local_1118;
  CFGNode *local_10f8;
  CFGNode *ladder_post;
  CFGNode *ladder_pre;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_10e0;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_10c0;
  anon_class_8_1_3dd19718 local_10a0;
  function<bool_(const_dxil_spv::CFGNode_*)> local_1098;
  char local_1078 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  CFGNode *true_block;
  uint local_58;
  uint local_4c;
  CFGNode *pCStack_48;
  uint header_index;
  CFGNode *ladder;
  CFGNode *new_ladder_block;
  CFGNode *full_break_target_local;
  CFGNode *target_header_local;
  CFGNode *loop_ladder_local;
  CFGNode *header_local;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  
  ladder = (CFGNode *)0x0;
  new_ladder_block = full_break_target;
  full_break_target_local = target_header;
  target_header_local = loop_ladder;
  loop_ladder_local = header;
  header_local = node;
  node_local = (CFGNode *)this;
  if ((target_header == (CFGNode *)0x0) && (full_break_target == (CFGNode *)0x0)) {
    bVar4 = std::
            vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
            empty(&(loop_ladder->ir).operations);
    if (bVar4) {
      traverse_dominated_blocks_and_rewrite_branch
                (this,loop_ladder_local,header_local,target_header_local);
    }
    else {
      ladder_post = create_helper_pred_block(this,target_header_local);
      local_10f8 = create_helper_succ_block(this,target_header_local);
      traverse_dominated_blocks_and_rewrite_branch(this,loop_ladder_local,header_local,ladder_post);
      false_block = target_header_local;
      pCVar2 = ladder_post;
      pCVar1 = local_10f8;
      local_1120.normal_preds = normal_preds;
      std::function<bool(dxil_spv::CFGNode_const*)>::
      function<dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__1,void>
                ((function<bool(dxil_spv::CFGNode_const*)> *)&local_1118,&local_1120);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      basic_string(&local_1160,"ladder_phi_",&local_1161);
      std::operator+(&local_1140,&local_1160,&target_header_local->name);
      rewrite_ladder_conditional_branch_from_incoming_blocks
                (this,pCVar2,pCVar1,false_block,&local_1118,&local_1140);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      ~basic_string(&local_1140);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      ~basic_string(&local_1160);
      std::function<bool_(const_dxil_spv::CFGNode_*)>::~function(&local_1118);
      ladder = ladder_post;
    }
  }
  else {
    pCStack_48 = create_helper_pred_block(this,loop_ladder);
    local_4c = 0;
    ladder = pCStack_48;
    while ((uVar3 = local_4c,
           sVar5 = std::
                   vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ::size(&header_local->headers), uVar3 < (uint)sVar5 &&
           (ppCVar6 = std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::operator[](&header_local->headers,(ulong)local_4c),
           *ppCVar6 != loop_ladder_local))) {
      local_4c = local_4c + 1;
    }
    uVar7 = (ulong)local_4c;
    sVar5 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            size(&header_local->headers);
    if (uVar7 == sVar5) {
      __assert_fail("header_index != node->headers.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x19bf,
                    "CFGNode *dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(CFGNode *, CFGNode *, CFGNode *, CFGNode *, CFGNode *, const UnorderedSet<const CFGNode *> &)"
                   );
    }
    if ((local_4c != 0) || (bVar4 = block_is_plain_continue(header_local), bVar4)) {
      true_block = header_local;
      local_58 = local_4c;
      traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2>
                (this,loop_ladder_local,header_local,pCStack_48,
                 (anon_class_16_2_63404077 *)&true_block);
    }
    cb = (_func_void_void_ptr_LogLevel_char_ptr *)0x0;
    if ((full_break_target_local == (CFGNode *)0x0) ||
       (full_break_target_local->loop_ladder_block == (CFGNode *)0x0)) {
      if ((full_break_target_local == (CFGNode *)0x0) ||
         (full_break_target_local->loop_merge_block == (CFGNode *)0x0)) {
        if (new_ladder_block == (CFGNode *)0x0) {
          p_Var8 = get_thread_log_callback();
          if (p_Var8 == (LoggingCallback)0x0) {
            fprintf(_stderr,"[WARN]: No loop merge block?\n");
            fflush(_stderr);
          }
          else {
            snprintf(local_1078,0x1000,"No loop merge block?\n");
            pvVar9 = get_thread_log_callback_userdata();
            (*p_Var8)(pvVar9,Warn,local_1078);
          }
        }
        else {
          cb = (_func_void_void_ptr_LogLevel_char_ptr *)new_ladder_block;
        }
      }
      else {
        cb = (_func_void_void_ptr_LogLevel_char_ptr *)full_break_target_local->loop_merge_block;
      }
    }
    else {
      cb = (_func_void_void_ptr_LogLevel_char_ptr *)full_break_target_local->loop_ladder_block;
    }
    pCVar2 = target_header_local;
    pCVar1 = pCStack_48;
    if (cb != (_func_void_void_ptr_LogLevel_char_ptr *)0x0) {
      local_10a0.normal_preds = normal_preds;
      std::function<bool(dxil_spv::CFGNode_const*)>::
      function<dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__0,void>
                ((function<bool(dxil_spv::CFGNode_const*)> *)&local_1098,&local_10a0);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      basic_string(&local_10e0,"ladder_phi_",(ThreadLocalAllocator<char> *)((long)&ladder_pre + 7));
      std::operator+(&local_10c0,&local_10e0,&target_header_local->name);
      rewrite_ladder_conditional_branch_from_incoming_blocks
                (this,pCVar1,(CFGNode *)cb,pCVar2,&local_1098,&local_10c0);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      ~basic_string(&local_10c0);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      ~basic_string(&local_10e0);
      std::function<bool_(const_dxil_spv::CFGNode_*)>::~function(&local_1098);
      if ((pCStack_48->ir).terminator.true_block == (pCStack_48->ir).terminator.false_block) {
        (pCStack_48->ir).terminator.direct_block = (pCStack_48->ir).terminator.true_block;
        (pCStack_48->ir).terminator.type = Branch;
      }
    }
  }
  return ladder;
}

Assistant:

CFGNode *CFGStructurizer::build_ladder_block_for_escaping_edge_handling(CFGNode *node, CFGNode *header,
                                                                        CFGNode *loop_ladder,
                                                                        CFGNode *target_header,
                                                                        CFGNode *full_break_target,
                                                                        const UnorderedSet<const CFGNode *> &normal_preds)
{
	CFGNode *new_ladder_block = nullptr;

	if (target_header || full_break_target)
	{
		// If we have a ladder block, there exists a merge candidate which the loop header dominates.
		// We create a ladder block before the merge block, which becomes the true merge block.
		// In this ladder block, we can detect with Phi nodes whether the break was "clean",
		// or if we had an escape edge.
		// If we have an escape edge, we can break to outer level, and continue the ladder that way.
		// Otherwise we branch to the existing merge block and continue as normal.
		// We'll also need to rewrite a lot of Phi nodes this way as well.
		auto *ladder = create_helper_pred_block(loop_ladder);
		new_ladder_block = ladder;

		unsigned header_index;
		for (header_index = 0; header_index < uint32_t(node->headers.size()); header_index++)
			if (node->headers[header_index] == header)
				break;

		assert(header_index != node->headers.size());

		// Merge to ladder instead.
		// If we're fixing up ladders for header index 0 it means we've already rewritten everything,
		// only apply the last fixup branch.
		if (header_index != 0 || block_is_plain_continue(node))
		{
			traverse_dominated_blocks_and_rewrite_branch(
				header, node, ladder,
				[node, header_index](const CFGNode *next)
				{
					for (unsigned i = 0; i < header_index; i++)
					{
						auto *target = node->headers[i];
						// Do not introduce cycles. Outer scopes must never be rewritten to branch to inner scopes.
						if (target && target->loop_ladder_block == next)
							return false;
					}
					return true;
				});
		}

		CFGNode *true_block = nullptr;

		// Ladder breaks out to outer scope.
		if (target_header && target_header->loop_ladder_block)
			true_block = target_header->loop_ladder_block;
		else if (target_header && target_header->loop_merge_block)
			true_block = target_header->loop_merge_block;
		else if (full_break_target)
			true_block = full_break_target;
		else
			LOGW("No loop merge block?\n");

		if (true_block)
		{
			rewrite_ladder_conditional_branch_from_incoming_blocks(
				ladder,
				true_block, loop_ladder, [&](const CFGNode *n) { return normal_preds.count(n) == 0; },
				String("ladder_phi_") + loop_ladder->name);

			// This can happen in some scenarios, fixup the branch to be a direct one instead.
			if (ladder->ir.terminator.true_block == ladder->ir.terminator.false_block)
			{
				ladder->ir.terminator.direct_block = ladder->ir.terminator.true_block;
				ladder->ir.terminator.type = Terminator::Type::Branch;
			}
		}
	}
	else
	{
		// Here, loop_ladder -> final merge is a trivial, direct branch.

		if (loop_ladder->ir.operations.empty())
		{
			// Simplest common case.
			// If the loop ladder just branches to outer scope, and this block does not perform
			// any operations we can avoid messing around with ladder PHI variables and just execute the branch.
			// This block will likely become a frontier node when merging PHI instead.
			// This is a common case when breaking out of a simple for loop.
			traverse_dominated_blocks_and_rewrite_branch(header, node, loop_ladder);
		}
		else
		{
			// We have a case where we're trivially breaking out of a selection construct,
			// but the loop ladder block contains operations which we must not execute,
			// since we were supposed to branch directly out to node.
			// We cannot directly break out of a selection construct, so our ladder must be a bit more sophisticated.
			// ladder-pre -> merge -> ladder-post -> selection merge
			//      \-------------------/
			auto *ladder_pre = create_helper_pred_block(loop_ladder);
			auto *ladder_post = create_helper_succ_block(loop_ladder);

			// Merge to ladder instead.
			traverse_dominated_blocks_and_rewrite_branch(header, node, ladder_pre);

			rewrite_ladder_conditional_branch_from_incoming_blocks(
				ladder_pre,
				ladder_post, loop_ladder,
				[&](const CFGNode *n) { return normal_preds.count(n) == 0; },
				String("ladder_phi_") + loop_ladder->name);

			new_ladder_block = ladder_pre;
		}
	}

	return new_ladder_block;
}